

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<int>::FindNEQ
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<int> *this,int k)

{
  _Self __tmp;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> s2;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_50;
  
  FindGreater(__return_storage_ptr__,this,k,false);
  FindLess((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_50,this,k,false);
  for (; (_Rb_tree_header *)local_50._M_impl.super__Rb_tree_header._M_header._M_left !=
         &local_50._M_impl.super__Rb_tree_header;
      local_50._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_50._M_impl.super__Rb_tree_header._M_header._M_left)) {
    std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
    _M_insert_unique<Addr_const&>
              ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
               __return_storage_ptr__,
               (Addr *)(local_50._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  }
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::clear
            (&local_50);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_50);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindNEQ(K k) {
	set<Addr> s1 = this->FindGreater(k, false);
	set<Addr> s2 = this->FindLess(k, false);
	set<Addr>::iterator it;
	for (it = s2.begin(); it != s2.end(); it++) {
		s1.insert(*it);
	}
	s2.clear();
	return s1;
}